

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

void __thiscall spectest::JSONParser::SkipWhitespace(JSONParser *this)

{
  int iVar1;
  JSONParser *this_local;
  
  do {
    iVar1 = ReadChar(this);
    if (iVar1 == -1) {
      return;
    }
  } while (((iVar1 - 9U < 2) || (iVar1 == 0xd)) || (iVar1 == 0x20));
  PutbackChar(this);
  return;
}

Assistant:

void JSONParser::SkipWhitespace() {
  while (1) {
    switch (ReadChar()) {
      case -1:
        return;

      case ' ':
      case '\t':
      case '\n':
      case '\r':
        break;

      default:
        PutbackChar();
        return;
    }
  }
}